

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OptimizeInstructions.cpp
# Opt level: O3

void __thiscall
wasm::OptimizeInstructions::visitStructCmpxchg(OptimizeInstructions *this,StructCmpxchg *curr)

{
  Expression **input;
  BinaryOp BVar1;
  Module *pMVar2;
  uintptr_t uVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  Type this_00;
  bool bVar8;
  Shareability SVar9;
  Index IVar10;
  Index index;
  Index index_00;
  Index IVar11;
  Drop *this_01;
  Drop *this_02;
  Block *pBVar12;
  Expression *pEVar13;
  StructGet *this_03;
  LocalSet *this_04;
  Expression *pEVar14;
  StructSet *this_05;
  If *this_06;
  ulong in_RCX;
  ulong extraout_RDX;
  ulong uVar15;
  Type in_R8;
  optional<wasm::Type> type_;
  optional<wasm::Type> type;
  optional<wasm::Type> type_00;
  initializer_list<wasm::Expression_*> local_98;
  HeapType local_88;
  LocalSet *local_80;
  LocalSet *local_78;
  Block *local_70;
  Index local_64;
  uintptr_t local_60;
  Binary *local_58;
  Expression *local_50;
  Type local_48;
  Expression *local_40;
  Builder local_38;
  Builder builder;
  
  input = &curr->ref;
  skipNonNullCast(this,input,(Expression *)curr);
  bVar8 = trapOnNull(this,(Expression *)curr,input);
  if ((!bVar8) && (bVar8 = wasm::Type::isStruct(&(*input)->type), bVar8)) {
    pMVar2 = (this->
             super_WalkerPass<wasm::PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>_>
             ).
             super_PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
             .
             super_Walker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
             .currModule;
    local_38.wasm = pMVar2;
    local_88 = wasm::Type::getHeapType(&(*input)->type);
    SVar9 = HeapType::getShared(&local_88);
    if ((SVar9 != Shared) || (curr->order != SeqCst)) {
      bVar8 = areConsecutiveInputsEqual(this,curr->expected,curr->replacement);
      if (bVar8) {
        local_50 = curr->ref;
        local_40 = curr->expected;
        this_01 = (Drop *)MixedArena::allocSpace(&pMVar2->allocator,0x18,8);
        (this_01->super_SpecificExpression<(wasm::Expression::Id)18>).super_Expression._id = DropId;
        (this_01->super_SpecificExpression<(wasm::Expression::Id)18>).super_Expression.type.id = 0;
        this_01->value = local_40;
        Drop::finalize(this_01);
        local_40 = curr->replacement;
        this_02 = (Drop *)MixedArena::allocSpace(&(local_38.wasm)->allocator,0x18,8);
        (this_02->super_SpecificExpression<(wasm::Expression::Id)18>).super_Expression._id = DropId;
        (this_02->super_SpecificExpression<(wasm::Expression::Id)18>).super_Expression.type.id = 0;
        this_02->value = local_40;
        Drop::finalize(this_02);
        type.super__Optional_base<wasm::Type,_true,_true>._M_payload.
        super__Optional_payload_base<wasm::Type>._8_8_ = 0;
        type.super__Optional_base<wasm::Type,_true,_true>._M_payload.
        super__Optional_payload_base<wasm::Type>._M_payload = (_Storage<wasm::Type,_true>)in_RCX;
        pBVar12 = Builder::makeSequence(&local_38,(Expression *)this_01,(Expression *)this_02,type);
        local_40 = getResultOfFirst(local_50,(Expression *)pBVar12,
                                    (this->
                                    super_WalkerPass<wasm::PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>_>
                                    ).
                                    super_PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
                                    .
                                    super_Walker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
                                    .currFunction,
                                    (this->
                                    super_WalkerPass<wasm::PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>_>
                                    ).
                                    super_PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
                                    .
                                    super_Walker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
                                    .currModule,
                                    &((this->
                                      super_WalkerPass<wasm::PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>_>
                                      ).super_Pass.runner)->options);
        IVar10 = curr->index;
        local_50 = (Expression *)CONCAT44(local_50._4_4_,curr->order);
        uVar3 = (curr->super_SpecificExpression<(wasm::Expression::Id)69>).super_Expression.type.id;
        pBVar12 = (Block *)MixedArena::allocSpace(&(local_38.wasm)->allocator,0x28,8);
        (((SpecificExpression<(wasm::Expression::Id)66> *)
         &pBVar12->super_SpecificExpression<(wasm::Expression::Id)1>)->super_Expression)._id =
             StructGetId;
        *(Index *)&(pBVar12->name).super_IString.str._M_len = IVar10;
        (pBVar12->name).super_IString.str._M_str = (char *)local_40;
        (((SpecificExpression<(wasm::Expression::Id)66> *)
         &pBVar12->super_SpecificExpression<(wasm::Expression::Id)1>)->super_Expression).type.id =
             uVar3;
        *(bool *)&(pBVar12->list).
                  super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.data =
             false;
        *(MemoryOrder *)
         ((long)&(pBVar12->list).
                 super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.data + 4
         ) = (MemoryOrder)local_50;
        StructGet::finalize((StructGet *)pBVar12);
      }
      else {
        local_88 = wasm::Type::getHeapType(&(*input)->type);
        SVar9 = HeapType::getShared(&local_88);
        if (SVar9 == Shared) {
          return;
        }
        auVar4._8_8_ = 0;
        auVar4._0_8_ = (curr->ref->type).id;
        IVar10 = Builder::addVar((Builder *)
                                 (this->
                                 super_WalkerPass<wasm::PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>_>
                                 ).
                                 super_PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
                                 .
                                 super_Walker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
                                 .currFunction,(Function *)0x0,(Name)(auVar4 << 0x40),in_R8);
        local_40 = (Expression *)CONCAT44(local_40._4_4_,IVar10);
        auVar5._8_8_ = 0;
        auVar5._0_8_ = (curr->super_SpecificExpression<(wasm::Expression::Id)69>).super_Expression.
                       type.id;
        index = Builder::addVar((Builder *)
                                (this->
                                super_WalkerPass<wasm::PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>_>
                                ).
                                super_PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
                                .
                                super_Walker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
                                .currFunction,(Function *)0x0,(Name)(auVar5 << 0x40),in_R8);
        local_58 = (Binary *)CONCAT44(local_58._4_4_,index);
        auVar6._8_8_ = 0;
        auVar6._0_8_ = (curr->super_SpecificExpression<(wasm::Expression::Id)69>).super_Expression.
                       type.id;
        index_00 = Builder::addVar((Builder *)
                                   (this->
                                   super_WalkerPass<wasm::PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>_>
                                   ).
                                   super_PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
                                   .
                                   super_Walker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
                                   .currFunction,(Function *)0x0,(Name)(auVar6 << 0x40),in_R8);
        auVar7._8_8_ = 0;
        auVar7._0_8_ = (curr->super_SpecificExpression<(wasm::Expression::Id)69>).super_Expression.
                       type.id;
        IVar11 = Builder::addVar((Builder *)
                                 (this->
                                 super_WalkerPass<wasm::PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>_>
                                 ).
                                 super_PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
                                 .
                                 super_Walker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
                                 .currFunction,(Function *)0x0,(Name)(auVar7 << 0x40),in_R8);
        local_50 = (Expression *)CONCAT44(local_50._4_4_,IVar11);
        local_88.id = (uintptr_t)Builder::makeLocalSet(&local_38,IVar10,curr->ref);
        local_80 = Builder::makeLocalSet(&local_38,index,curr->expected);
        local_64 = index_00;
        local_78 = Builder::makeLocalSet(&local_38,index_00,curr->replacement);
        local_98._M_array = (iterator)&local_88;
        local_98._M_len = 3;
        type_00.super__Optional_base<wasm::Type,_true,_true>._M_payload.
        super__Optional_payload_base<wasm::Type>._8_8_ = 0;
        type_00.super__Optional_base<wasm::Type,_true,_true>._M_payload.
        super__Optional_payload_base<wasm::Type>._M_payload =
             (_Storage<wasm::Type,_true>)extraout_RDX;
        local_70 = Builder::makeBlock<std::initializer_list<wasm::Expression_*>,_true>
                             (&local_38,&local_98,type_00);
        local_48.id._0_4_ = curr->index;
        uVar3 = (curr->ref->type).id;
        pEVar13 = (Expression *)MixedArena::allocSpace(&(local_38.wasm)->allocator,0x18,8);
        pEVar13->_id = LocalGetId;
        *(undefined4 *)(pEVar13 + 1) = local_40._0_4_;
        (pEVar13->type).id = uVar3;
        local_60 = (curr->super_SpecificExpression<(wasm::Expression::Id)69>).super_Expression.type.
                   id;
        this_03 = (StructGet *)MixedArena::allocSpace(&(local_38.wasm)->allocator,0x28,8);
        (this_03->super_SpecificExpression<(wasm::Expression::Id)66>).super_Expression._id =
             StructGetId;
        this_03->index = (Index)local_48.id;
        this_03->ref = pEVar13;
        (this_03->super_SpecificExpression<(wasm::Expression::Id)66>).super_Expression.type.id =
             local_60;
        this_03->signed_ = false;
        this_03->order = Unordered;
        StructGet::finalize(this_03);
        local_48.id = (curr->super_SpecificExpression<(wasm::Expression::Id)69>).super_Expression.
                      type.id;
        this_04 = (LocalSet *)MixedArena::allocSpace(&(local_38.wasm)->allocator,0x20,8);
        (this_04->super_SpecificExpression<(wasm::Expression::Id)9>).super_Expression._id =
             LocalSetId;
        (this_04->super_SpecificExpression<(wasm::Expression::Id)9>).super_Expression.type.id = 0;
        this_04->index = (MemoryOrder)local_50;
        this_04->value = (Expression *)this_03;
        LocalSet::makeTee(this_04,local_48);
        local_48.id = (curr->super_SpecificExpression<(wasm::Expression::Id)69>).super_Expression.
                      type.id;
        pEVar13 = (Expression *)MixedArena::allocSpace(&(local_38.wasm)->allocator,0x18,8);
        pEVar13->_id = LocalGetId;
        *(undefined4 *)(pEVar13 + 1) = local_58._0_4_;
        (pEVar13->type).id = local_48.id;
        uVar15 = (curr->super_SpecificExpression<(wasm::Expression::Id)69>).super_Expression.type.id
        ;
        if ((uVar15 & 1) == 0 && 6 < uVar15) {
          local_58 = (Binary *)MixedArena::allocSpace(&(local_38.wasm)->allocator,0x20,8);
          (((SpecificExpression<(wasm::Expression::Id)44> *)
           &local_58->super_SpecificExpression<(wasm::Expression::Id)16>)->super_Expression)._id =
               RefEqId;
          (((SpecificExpression<(wasm::Expression::Id)44> *)
           &local_58->super_SpecificExpression<(wasm::Expression::Id)16>)->super_Expression).type.id
               = 0;
          *(LocalSet **)&local_58->op = this_04;
          local_58->left = pEVar13;
          RefEq::finalize((RefEq *)local_58);
        }
        else {
          if (6 < uVar15) {
            __assert_fail("isBasic() && \"Basic type expected\"",
                          "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm-type.h"
                          ,0x1c4,"BasicType wasm::Type::getBasic() const");
          }
          BVar1 = *(BinaryOp *)(&DAT_00df9190 + uVar15 * 4);
          local_58 = (Binary *)MixedArena::allocSpace(&(local_38.wasm)->allocator,0x28,8);
          (local_58->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression._id =
               BinaryId;
          (local_58->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression.type.id =
               0;
          local_58->op = BVar1;
          local_58->left = (Expression *)this_04;
          local_58->right = pEVar13;
          Binary::finalize(local_58);
        }
        local_48.id = (uintptr_t)&local_70->list;
        local_60 = CONCAT44(local_60._4_4_,curr->index);
        uVar3 = (curr->ref->type).id;
        pEVar13 = (Expression *)MixedArena::allocSpace(&(local_38.wasm)->allocator,0x18,8);
        pEVar13->_id = LocalGetId;
        *(undefined4 *)(pEVar13 + 1) = local_40._0_4_;
        (pEVar13->type).id = uVar3;
        uVar3 = (curr->super_SpecificExpression<(wasm::Expression::Id)69>).super_Expression.type.id;
        pEVar14 = (Expression *)MixedArena::allocSpace(&(local_38.wasm)->allocator,0x18,8);
        pEVar14->_id = LocalGetId;
        *(Index *)(pEVar14 + 1) = local_64;
        (pEVar14->type).id = uVar3;
        this_05 = (StructSet *)MixedArena::allocSpace(&(local_38.wasm)->allocator,0x30,8);
        (this_05->super_SpecificExpression<(wasm::Expression::Id)67>).super_Expression._id =
             StructSetId;
        (this_05->super_SpecificExpression<(wasm::Expression::Id)67>).super_Expression.type.id = 0;
        this_05->index = (Index)local_60;
        this_05->ref = pEVar13;
        this_05->value = pEVar14;
        this_05->order = Unordered;
        StructSet::finalize(this_05);
        uVar15 = 0x28;
        this_06 = (If *)MixedArena::allocSpace(&(local_38.wasm)->allocator,0x28,8);
        (this_06->super_SpecificExpression<(wasm::Expression::Id)2>).super_Expression._id = IfId;
        (this_06->super_SpecificExpression<(wasm::Expression::Id)2>).super_Expression.type.id = 0;
        this_06->condition = (Expression *)local_58;
        this_06->ifTrue = (Expression *)this_05;
        this_06->ifFalse = (Expression *)0x0;
        type_.super__Optional_base<wasm::Type,_true,_true>._M_payload.
        super__Optional_payload_base<wasm::Type>._8_8_ = 0;
        type_.super__Optional_base<wasm::Type,_true,_true>._M_payload.
        super__Optional_payload_base<wasm::Type>._M_payload = (_Storage<wasm::Type,_true>)uVar15;
        If::finalize(this_06,type_);
        this_00.id = local_48.id;
        ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::push_back
                  ((ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*> *)
                   local_48.id,(Expression *)this_06);
        uVar3 = (curr->super_SpecificExpression<(wasm::Expression::Id)69>).super_Expression.type.id;
        pEVar13 = (Expression *)MixedArena::allocSpace(&(local_38.wasm)->allocator,0x18,8);
        pEVar13->_id = LocalGetId;
        *(MemoryOrder *)(pEVar13 + 1) = (MemoryOrder)local_50;
        (pEVar13->type).id = uVar3;
        ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::push_back
                  ((ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*> *)
                   this_00.id,pEVar13);
        (((SpecificExpression<(wasm::Expression::Id)66> *)
         &local_70->super_SpecificExpression<(wasm::Expression::Id)1>)->super_Expression).type.id =
             (curr->super_SpecificExpression<(wasm::Expression::Id)69>).super_Expression.type.id;
        pBVar12 = local_70;
      }
      replaceCurrent(this,(Expression *)pBVar12);
    }
  }
  return;
}

Assistant:

void visitStructCmpxchg(StructCmpxchg* curr) {
    skipNonNullCast(curr->ref, curr);
    if (trapOnNull(curr, curr->ref)) {
      return;
    }

    if (!curr->ref->type.isStruct()) {
      return;
    }

    Builder builder(*getModule());

    // As with other RMW operations, we cannot optimize if the RMW is
    // sequentially consistent and to shared memory.
    if (curr->ref->type.getHeapType().isShared() &&
        curr->order == MemoryOrder::SeqCst) {
      return;
    }

    // Just like other RMW operations, unshared or release-acquire cmpxchg can
    // be optimized to just a read if it is known not to change the in-memory
    // value. This is the case when `expected` and `replacement` are known to be
    // the same.
    if (areConsecutiveInputsEqual(curr->expected, curr->replacement)) {
      auto* ref = getResultOfFirst(
        curr->ref,
        builder.makeSequence(builder.makeDrop(curr->expected),
                             builder.makeDrop(curr->replacement)));
      replaceCurrent(
        builder.makeStructGet(curr->index, ref, curr->order, curr->type));
      return;
    }

    if (curr->ref->type.getHeapType().isShared()) {
      return;
    }

    // Just like other RMW operations, lower to basic operations when operating
    // on unshared memory.
    auto ref = builder.addVar(getFunction(), curr->ref->type);
    auto expected = builder.addVar(getFunction(), curr->type);
    auto replacement = builder.addVar(getFunction(), curr->type);
    auto result = builder.addVar(getFunction(), curr->type);
    auto* block =
      builder.makeBlock({builder.makeLocalSet(ref, curr->ref),
                         builder.makeLocalSet(expected, curr->expected),
                         builder.makeLocalSet(replacement, curr->replacement)});
    auto* lhs = builder.makeLocalTee(
      result,
      builder.makeStructGet(curr->index,
                            builder.makeLocalGet(ref, curr->ref->type),
                            MemoryOrder::Unordered,
                            curr->type),
      curr->type);
    auto* rhs = builder.makeLocalGet(expected, curr->type);
    Expression* pred = nullptr;
    if (curr->type.isRef()) {
      pred = builder.makeRefEq(lhs, rhs);
    } else {
      pred = builder.makeBinary(
        Abstract::getBinary(curr->type, Abstract::Eq), lhs, rhs);
    }
    block->list.push_back(builder.makeIf(
      pred,
      builder.makeStructSet(curr->index,
                            builder.makeLocalGet(ref, curr->ref->type),
                            builder.makeLocalGet(replacement, curr->type),
                            MemoryOrder::Unordered)));

    block->list.push_back(builder.makeLocalGet(result, curr->type));
    block->type = curr->type;
    replaceCurrent(block);
  }